

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * std::operator<<(ostream *o,Function *func)

{
  undefined1 local_1a0 [8];
  PrintSExpression print;
  Function *func_local;
  ostream *o_local;
  
  print.typePrinter.fallbackNames._M_h._M_single_bucket = (__node_base_ptr)func;
  ::wasm::PrintSExpression::PrintSExpression((PrintSExpression *)local_1a0,o);
  ::wasm::PrintSExpression::setMinify((PrintSExpression *)local_1a0,false);
  ::wasm::PrintSExpression::setDebugInfo((PrintSExpression *)local_1a0,false);
  ::wasm::PrintSExpression::visitFunction
            ((PrintSExpression *)local_1a0,
             (Function *)print.typePrinter.fallbackNames._M_h._M_single_bucket);
  ::wasm::PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a0);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Function& func) {
  wasm::PrintSExpression print(o);
  print.setMinify(false);
  print.setDebugInfo(false);
  print.visitFunction(&func);
  return o;
}